

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_dist_precompute(gauden_t *g,float32 varfloor)

{
  int iVar1;
  vector_t pfVar2;
  int iVar3;
  float32 ***pppfVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  double dVar12;
  
  pppfVar4 = (float32 ***)
             __ckd_calloc_3d__((long)g->n_mgau,(long)g->n_feat,(long)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                               ,0x157);
  g->det = pppfVar4;
  uVar7 = 0;
  for (lVar5 = 0; lVar5 < g->n_mgau; lVar5 = lVar5 + 1) {
    for (lVar8 = 0; lVar8 < g->n_feat; lVar8 = lVar8 + 1) {
      iVar1 = g->featlen[lVar8];
      pfVar9 = (float *)g->det[lVar5][lVar8];
      iVar3 = iVar1;
      if (iVar1 < 1) {
        iVar3 = 0;
      }
      for (lVar10 = 0; lVar10 < g->n_density; lVar10 = lVar10 + 1) {
        *pfVar9 = 0.0;
        pfVar2 = g->var[lVar5][lVar8][lVar10];
        for (lVar6 = 0; iVar3 != (int)lVar6; lVar6 = lVar6 + 1) {
          fVar11 = (float)pfVar2[lVar6];
          if ((float)pfVar2[lVar6] < (float)varfloor) {
            pfVar2[lVar6] = varfloor;
            uVar7 = uVar7 + 1;
            fVar11 = (float)varfloor;
          }
          dVar12 = log((double)fVar11);
          *pfVar9 = (float)dVar12 + *pfVar9;
          pfVar2[lVar6] = (float32)(1.0 / ((float)pfVar2[lVar6] + (float)pfVar2[lVar6]));
        }
        *pfVar9 = (*pfVar9 + (float)iVar1 * 1.837877) * 0.5;
        pfVar9 = pfVar9 + 1;
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x17f,"%d variance values floored\n",(ulong)uVar7);
  return 0;
}

Assistant:

int32
gauden_dist_precompute(gauden_t * g, float32 varfloor)
{
    int32 i, m, f, d, flen;
    float32 *varp, *detp;
    int32 n;

    n = 0;
    /* Allocate space for determinants */
    g->det =
        (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
                                    sizeof(float32));

    /** FIX ME!, There is no removal of Gaussian in ms_mgau. This is
	not yet synchronized with cont_mgau's behavior. */

    for (m = 0; m < g->n_mgau; m++) {
        for (f = 0; f < g->n_feat; f++) {
            flen = g->featlen[f];

            /* Determinants for all variance vectors in g->[m][f] */
            for (d = 0, detp = g->det[m][f]; d < g->n_density; d++, detp++) {
                *detp = (float32) 0.0;

                for (i = 0, varp = g->var[m][f][d]; i < flen; i++, varp++) {
                    if (*varp < varfloor) {
#if 0
                        E_INFO
                            ("varp %f , floor %f n=%d, m %d, f %d c %d, i %d\n",
                             *varp, varfloor, n, m, f, d, i);
#endif
                        *varp = varfloor;
                        n++;
                    }

                    *detp += (float32) (log(*varp));

                    /* Precompute this part of the exponential */
                    *varp = (float32) (1.0 / (*varp * 2.0));
                }

                /* 2pi */
                *detp += (float32) (flen * log(2.0 * M_PI));

                /* Sqrt */
                *detp *= (float32) 0.5;
            }
        }
    }

    if (1)
        E_INFO("%d variance values floored\n", n);

    return 0;
}